

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  uchar ***pppuVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int itemsize;
  int iVar11;
  int extraout_EDX;
  uint uVar12;
  int extraout_EDX_00;
  ulong extraout_RDX;
  ulong uVar13;
  uchar *puVar14;
  uchar *extraout_RDX_00;
  uchar **ppuVar15;
  undefined4 in_register_00000034;
  uchar *puVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  uint uStack_200ac;
  uint uStack_200a8;
  uint uStack_200a4;
  uchar *puStack_200a0;
  uchar *puStack_20098;
  ulong uStack_20090;
  byte *pbStack_20088;
  uchar *puStack_20080;
  uchar *puStack_20078;
  ulong uStack_20070;
  int iStack_20068;
  int iStack_20064;
  ulong uStack_20060;
  int *piStack_20058;
  size_t sStack_20050;
  ulong uStack_20048;
  uchar ***pppuStack_20040;
  uchar **hash_table [16384];
  
  uStack_20090 = CONCAT44(in_register_00000034,data_len);
  puStack_200a0 = (uchar *)0x0;
  uStack_20060 = 5;
  if (5 < quality) {
    uStack_20060 = (ulong)(uint)quality;
  }
  puStack_20098 = data;
  piStack_20058 = out_len;
  stbiw__sbgrowf(&puStack_200a0,1,(int)out_len);
  iVar19 = *(int *)(puStack_200a0 + -4);
  *(int *)(puStack_200a0 + -4) = iVar19 + 1;
  puStack_200a0[iVar19] = 'x';
  iVar10 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar10 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,itemsize);
    iVar10 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar10 + 1;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar10] = '^';
  uStack_200ac = 1;
  uStack_200a8 = uStack_200ac;
  puVar7 = stbiw__zlib_flushf(puStack_200a0,&uStack_200a8,(int *)&uStack_200ac);
  uStack_200a8 = uStack_200a8 | 1 << ((byte)uStack_200ac & 0x1f);
  uStack_200ac = uStack_200ac + 2;
  puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
  for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
    hash_table[lVar8] = (uchar **)0x0;
  }
  iStack_20064 = (int)uStack_20090 + -3;
  iStack_20068 = (int)uStack_20060 * 2;
  uStack_20048 = uStack_20060 & 0xffffffff;
  sStack_20050 = uStack_20048 * 8;
  uVar18 = 0;
  puStack_200a0 = puVar7;
  while (iVar19 = (int)uVar18, iVar19 < iStack_20064) {
    pbStack_20088 = puStack_20098 + iVar19;
    puStack_20078 = puVar7;
    uVar4 = stbiw__zhash(pbStack_20088);
    ppuVar15 = hash_table[uVar4 & 0x3fff];
    if (ppuVar15 == (uchar **)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = (long)*(int *)((long)ppuVar15 + -4);
    }
    pppuStack_20040 = hash_table + (uVar4 & 0x3fff);
    iVar10 = (int)uStack_20090;
    if (lVar8 < 1) {
      lVar8 = 0;
    }
    uStack_200a4 = 3;
    puStack_20080 = (uchar *)0x0;
    puVar7 = puStack_20098;
    uVar13 = extraout_RDX;
    uStack_20070 = uVar18;
    for (lVar17 = 0; pbVar1 = pbStack_20088, iVar11 = (int)uVar13, lVar8 != lVar17;
        lVar17 = lVar17 + 1) {
      puVar16 = ppuVar15[lVar17];
      if ((long)(iVar19 + -0x8000) < (long)puVar16 - (long)puVar7) {
        uVar5 = stbiw__zlib_countm(puVar16,pbStack_20088,iVar10 - iVar19);
        uVar4 = uStack_200a4;
        if ((int)uStack_200a4 < (int)uVar5) {
          uVar4 = uVar5;
        }
        uVar13 = (ulong)uVar4;
        bVar20 = (int)uStack_200a4 <= (int)uVar5;
        puVar7 = puStack_20098;
        uStack_200a4 = uVar4;
        if (bVar20) {
          puStack_20080 = puVar16;
        }
      }
    }
    if (ppuVar15 == (uchar **)0x0) {
LAB_0010a404:
      pppuVar3 = pppuStack_20040;
      stbiw__sbgrowf(pppuStack_20040,8,iVar11);
      ppuVar15 = *pppuVar3;
      iVar19 = *(int *)((long)ppuVar15 + -4);
      iVar10 = iVar19 + 1;
    }
    else {
      iVar19 = *(int *)((long)ppuVar15 + -4);
      if (iVar19 == iStack_20068) {
        memmove(ppuVar15,ppuVar15 + uStack_20048,sStack_20050);
        iVar19 = (int)uStack_20060;
        *(int *)((long)ppuVar15 + -4) = iVar19;
        iVar11 = extraout_EDX;
      }
      iVar10 = iVar19 + 1;
      if (*(int *)(ppuVar15 + -1) <= iVar10) goto LAB_0010a404;
    }
    *(int *)((long)ppuVar15 + -4) = iVar10;
    ppuVar15[iVar19] = pbVar1;
    if (puStack_20080 == (uchar *)0x0) {
LAB_0010a4b7:
      uVar5 = uStack_200a8;
      uVar4 = uStack_200ac;
      bVar2 = *pbStack_20088;
      bVar9 = (byte)uStack_200ac;
      if (bVar2 < 0x90) {
        iVar19 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
        uStack_200a8 = iVar19 << (bVar9 & 0x1f);
        uStack_200ac = uVar4 + 8;
      }
      else {
        iVar19 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
        uStack_200a8 = iVar19 << (bVar9 & 0x1f);
        uStack_200ac = uVar4 + 9;
      }
      uStack_200a8 = uVar5 | uStack_200a8;
      puVar7 = puStack_20078;
      uVar4 = 1;
LAB_0010a66d:
      puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
    }
    else {
      pbVar1 = pbStack_20088 + 1;
      uVar4 = stbiw__zhash(pbVar1);
      ppuVar15 = hash_table[uVar4 & 0x3fff];
      if (ppuVar15 == (uchar **)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint *)((long)ppuVar15 + -4);
      }
      uVar5 = (uint)uStack_20070;
      iVar19 = ~uVar5 + (int)uStack_20090;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      puVar7 = puStack_20098;
      for (uVar18 = 0; uVar4 != uVar18; uVar18 = uVar18 + 1) {
        if (((long)(int)(uVar5 - 0x7fff) < (long)ppuVar15[uVar18] - (long)puVar7) &&
           (uVar6 = stbiw__zlib_countm(ppuVar15[uVar18],pbVar1,iVar19), puVar7 = puStack_20098,
           (int)uStack_200a4 < (int)uVar6)) goto LAB_0010a4b7;
      }
      iVar19 = (int)pbStack_20088 - (int)puStack_20080;
      uVar18 = 0;
      do {
        uVar13 = uVar18;
        uVar18 = uVar13 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar13 + 1] <= (int)uStack_200a4);
      iVar10 = (int)(uVar13 + 1);
      if (uVar13 < 0x17) {
        iVar10 = stbiw__zlib_bitrev(iVar10,7);
        uStack_200a8 = uStack_200a8 | iVar10 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 7;
      }
      else {
        iVar10 = stbiw__zlib_bitrev(iVar10 + 0xa8,8);
        uStack_200a8 = uStack_200a8 | iVar10 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 8;
      }
      puVar7 = stbiw__zlib_flushf(puStack_20078,&uStack_200a8,(int *)&uStack_200ac);
      uVar13 = uVar13 & 0xffffffff;
      if (0xffffffffffffffeb < uVar13 - 0x1c) {
        uStack_200a8 = uStack_200a8 |
                       uStack_200a4 - stbi_zlib_compress::lengthc[uVar13] <<
                       ((byte)uStack_200ac & 0x1f);
        uStack_200ac = ""[uVar13] + uStack_200ac;
        puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
      }
      uVar18 = 0xffffffffffffffff;
      do {
        lVar8 = uVar18 + 2;
        uVar18 = uVar18 + 1;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar8] <= iVar19);
      iVar10 = stbiw__zlib_bitrev((int)uVar18,5);
      uStack_200a8 = uStack_200a8 | iVar10 << ((byte)uStack_200ac & 0x1f);
      uStack_200ac = uStack_200ac + 5;
      puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
      uVar4 = uStack_200a4;
      if (3 < uVar18) {
        uStack_200a8 = uStack_200a8 |
                       iVar19 - (uint)stbi_zlib_compress::distc[uVar18 & 0xffffffff] <<
                       ((byte)uStack_200ac & 0x1f);
        uStack_200ac = ""[uVar18 & 0xffffffff] + uStack_200ac;
        goto LAB_0010a66d;
      }
    }
    uVar18 = (ulong)(uVar4 + (int)uStack_20070);
  }
  lVar8 = (long)(int)uStack_20090;
  puStack_200a0 = puVar7;
  for (lVar17 = (long)iVar19; uVar5 = uStack_200a8, uVar4 = uStack_200ac, lVar17 < lVar8;
      lVar17 = lVar17 + 1) {
    bVar2 = puStack_20098[lVar17];
    if (bVar2 < 0x90) {
      uVar6 = bVar2 + 0x30;
      iVar19 = 8;
    }
    else {
      uVar6 = bVar2 | 0x100;
      iVar19 = 9;
    }
    iVar10 = stbiw__zlib_bitrev(uVar6,iVar19);
    uStack_200a8 = uVar5 | iVar10 << ((byte)uVar4 & 0x1f);
    uStack_200ac = iVar19 + uVar4;
    puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
  }
  puStack_200a0 = puVar7;
  iVar19 = stbiw__zlib_bitrev(0,7);
  uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
  uVar4 = uStack_200ac + 7;
  do {
    uStack_200ac = uVar4;
    puVar7 = stbiw__zlib_flushf(puVar7,&uStack_200a8,(int *)&uStack_200ac);
    uVar4 = uStack_200ac + 1;
  } while (uStack_200ac != 0);
  puVar16 = puStack_20098;
  puStack_200a0 = puVar7;
  for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
    if (hash_table[lVar8] != (uchar **)0x0) {
      free(hash_table[lVar8] + -1);
      puVar16 = puStack_20098;
    }
  }
  uVar18 = (long)((ulong)(uint)((int)uStack_20090 >> 0x1f) << 0x20 | uStack_20090 & 0xffffffff) %
           0x15b0;
  puVar14 = (uchar *)(uVar18 & 0xffffffff);
  uVar18 = uVar18 & 0xffffffff;
  uVar6 = 0;
  uVar4 = 1;
  for (uVar5 = 0; (int)uVar5 < (int)uStack_20090; uVar5 = uVar5 + iVar19) {
    iVar19 = (int)uVar18;
    uVar12 = uVar5;
    while( true ) {
      bVar20 = uVar18 == 0;
      uVar18 = uVar18 - 1;
      if (bVar20) break;
      uVar4 = uVar4 + puVar16[uVar12];
      uVar6 = uVar6 + uVar4;
      uVar12 = uVar12 + 1;
    }
    uVar4 = uVar4 % 0xfff1;
    puVar14 = (uchar *)((ulong)uVar6 % 0xfff1);
    uVar18 = 0x15b0;
    uVar6 = (uint)puVar14;
  }
  if (puVar7 != (uchar *)0x0) {
    iVar10 = *(int *)(puVar7 + -4);
    iVar19 = iVar10 + 1;
    puVar14 = puVar7;
    if (iVar19 < *(int *)(puVar7 + -8)) goto LAB_0010a803;
  }
  stbiw__sbgrowf(&puStack_200a0,1,(int)puVar14);
  iVar10 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar10 + 1;
  puVar7 = puStack_200a0;
LAB_0010a803:
  *(int *)(puVar7 + -4) = iVar19;
  puVar7[iVar10] = (uchar)(uVar6 >> 8);
  if (*(int *)(puVar7 + -8) <= *(int *)(puVar7 + -4) + 1) {
    stbiw__sbgrowf(&puStack_200a0,1,(int)puVar7);
    puVar7 = extraout_RDX_00;
  }
  iVar11 = (int)puVar7;
  iVar19 = *(int *)(puStack_200a0 + -4);
  *(int *)(puStack_200a0 + -4) = iVar19 + 1;
  puStack_200a0[iVar19] = (uchar)uVar6;
  iVar10 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar10 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,iVar11);
    iVar10 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar10 + 1;
    iVar11 = extraout_EDX_00;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar10] = (uchar)(uVar4 >> 8);
  iVar10 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar10 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,iVar11);
    iVar10 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar10 + 1;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar10] = (uchar)uVar4;
  iVar19 = *(int *)(puStack_200a0 + -4);
  *piStack_20058 = iVar19;
  puVar7 = (uchar *)memmove(puStack_200a0 + -8,puStack_200a0,(long)iVar19);
  return puVar7;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}